

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_win_part(ggml_context *ctx,ggml_tensor *a,int w)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  char *file;
  int iVar3;
  int iVar4;
  int64_t ne [4];
  int64_t local_48;
  long local_40;
  long local_38;
  long local_30;
  
  if (a->ne[3] == 1) {
    if (a->type == GGML_TYPE_F32) {
      local_40 = (long)w;
      local_48 = a->ne[0];
      iVar3 = (int)(((local_40 - a->ne[1] % local_40) % local_40 + a->ne[1]) / local_40);
      iVar4 = (int)(((local_40 - a->ne[2] % local_40) % local_40 + a->ne[2]) / local_40);
      local_30 = (long)(iVar3 * iVar4);
      local_38 = local_40;
      pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_48,(ggml_tensor *)0x0,0);
      if (pgVar1 != (ggml_tensor *)0x0) {
        pgVar1->op_params[0] = iVar3;
        pgVar1->op_params[1] = iVar4;
        pgVar1->op_params[2] = w;
        pgVar1->op = GGML_OP_WIN_PART;
        pgVar1->src[0] = a;
        return pgVar1;
      }
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h";
      pcVar2 = "tensor != NULL";
      iVar3 = 0x70;
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
      pcVar2 = "a->type == GGML_TYPE_F32";
      iVar3 = 0x1206;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c";
    pcVar2 = "a->ne[3] == 1";
    iVar3 = 0x1205;
  }
  ggml_abort(file,iVar3,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_win_part(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int                   w) {
    GGML_ASSERT(a->ne[3] == 1);
    GGML_ASSERT(a->type  == GGML_TYPE_F32);

    // padding
    const int px = (w - a->ne[1]%w)%w;
    const int py = (w - a->ne[2]%w)%w;

    const int npx = (px + a->ne[1])/w;
    const int npy = (py + a->ne[2])/w;
    const int np  = npx*npy;

    const int64_t ne[4] = { a->ne[0], w, w, np, };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    int32_t params[] = { npx, npy, w };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_WIN_PART;
    result->src[0] = a;

    return result;
}